

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void __thiscall Liby::ExitCaller::callImp(ExitCaller *this,function<void_()> *functor)

{
  int iVar1;
  _Node *p_Var2;
  undefined8 uVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&ExitCallerMutex);
  if (iVar1 == 0) {
    p_Var2 = std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
             _M_create_node<std::function<void()>const&>
                       ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
                        &ExitCallerFunctors_abi_cxx11_,functor);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    ExitCallerFunctors_abi_cxx11_.
    super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    _M_node._M_size =
         ExitCallerFunctors_abi_cxx11_.
         super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
         _M_node._M_size + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&ExitCallerMutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&ExitCallerMutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void ExitCaller::callImp(const std::function<void()> &functor) {
    std::lock_guard<std::mutex> G_(ExitCallerMutex);
    ExitCallerFunctors.push_back(functor);
}